

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

size_t __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SpaceUsedExcludingSelfLong<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  size_t sVar1;
  long in_RDI;
  int i;
  size_t allocated_bytes;
  undefined4 local_14;
  undefined8 local_10;
  
  local_10 = (long)*(int *)(in_RDI + 0xc) << 3;
  if (*(long *)(in_RDI + 0x10) != 0) {
    for (local_14 = 0; local_14 < **(int **)(in_RDI + 0x10); local_14 = local_14 + 1) {
      cast<google::protobuf::RepeatedPtrField<google::protobuf::Message>::TypeHandler>
                (*(void **)(*(long *)(in_RDI + 0x10) + 8 + (long)local_14 * 8));
      sVar1 = GenericTypeHandler<google::protobuf::Message>::SpaceUsedLong((Message *)0x41cc50);
      local_10 = sVar1 + local_10;
    }
    local_10 = local_10 + 8;
  }
  return local_10;
}

Assistant:

inline size_t RepeatedPtrFieldBase::SpaceUsedExcludingSelfLong() const {
  size_t allocated_bytes = static_cast<size_t>(total_size_) * sizeof(void*);
  if (rep_ != NULL) {
    for (int i = 0; i < rep_->allocated_size; ++i) {
      allocated_bytes +=
          TypeHandler::SpaceUsedLong(*cast<TypeHandler>(rep_->elements[i]));
    }
    allocated_bytes += kRepHeaderSize;
  }
  return allocated_bytes;
}